

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

EulerAngles *
AML::eulerAngleKinematicRates
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,Vector3 *bodyRates)

{
  EulerSequence EVar1;
  double in_XMM2_Qa;
  Vector3 eulerRates;
  anon_union_24_2_4720223f_for_Vector3_0 local_a8;
  anon_union_24_2_4720223f_for_Vector3_0 local_88;
  Matrix33 local_70;
  
  Vector3::Vector3((Vector3 *)&local_a8.field_1);
  EVar1 = angles->seq_;
  switch(EVar1) {
  case ZXZ:
    eulerAngleRatesMatrix_ZXZ(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case XYX:
    eulerAngleRatesMatrix_XYX(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case YZY:
    eulerAngleRatesMatrix_YZY(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case ZYZ:
    eulerAngleRatesMatrix_ZYZ(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case XZX:
    eulerAngleRatesMatrix_XZX(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case YXY:
    eulerAngleRatesMatrix_YXY(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case XYZ:
    eulerAngleRatesMatrix_XYZ(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case YZX:
    eulerAngleRatesMatrix_YZX(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case ZXY:
    eulerAngleRatesMatrix_ZXY(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case XZY:
    eulerAngleRatesMatrix_XZY(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case ZYX:
    eulerAngleRatesMatrix_ZYX(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  case YXZ:
    eulerAngleRatesMatrix_YXZ(&local_70,angles->phi,angles->theta,in_XMM2_Qa);
    break;
  default:
    goto switchD_0015dbf0_default;
  }
  operator*((Vector3 *)&local_88.field_1,&local_70,bodyRates);
  local_a8.data[2] = local_88.data[2];
  local_a8.data[0] = local_88.data[0];
  local_a8.data[1] = local_88.data[1];
switchD_0015dbf0_default:
  __return_storage_ptr__->phi = local_a8.data[0];
  __return_storage_ptr__->theta = local_a8.data[1];
  __return_storage_ptr__->psi = local_a8.data[2];
  __return_storage_ptr__->seq_ = EVar1;
  return __return_storage_ptr__;
}

Assistant:

EulerAngles eulerAngleKinematicRates(const EulerAngles& angles, const Vector3& bodyRates)
    {
        Vector3 eulerRates;
        EulerAngles::EulerSequence seq = angles.getEulerSequence();
        switch (seq)
        {
        case EulerAngles::EulerSequence::XYZ:
            eulerRates = eulerAngleRatesMatrix_XYZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZXZ:
            eulerRates = eulerAngleRatesMatrix_ZXZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YZY:
            eulerRates = eulerAngleRatesMatrix_YZY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::XYX:
            eulerRates = eulerAngleRatesMatrix_XYX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZYZ:
            eulerRates = eulerAngleRatesMatrix_ZYZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::XZX:
            eulerRates = eulerAngleRatesMatrix_XZX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YXY:
            eulerRates = eulerAngleRatesMatrix_YXY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YZX:
            eulerRates = eulerAngleRatesMatrix_YZX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZXY:
            eulerRates = eulerAngleRatesMatrix_ZXY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::XZY:
            eulerRates = eulerAngleRatesMatrix_XZY(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::ZYX:
            eulerRates = eulerAngleRatesMatrix_ZYX(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        case EulerAngles::EulerSequence::YXZ:
            eulerRates = eulerAngleRatesMatrix_YXZ(angles.phi, angles.theta, angles.psi) * bodyRates;
            break;
        }
        return EulerAngles(eulerRates.x, eulerRates.y, eulerRates.z, seq);
    }